

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O3

void __thiscall Timidity::Renderer::start_note(Renderer *this,int chan,int note,int vel)

{
  bool bVar1;
  uint note_00;
  Sample *sp;
  int iVar2;
  int iVar3;
  Instrument *pIVar4;
  Sample *pSVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  iVar2 = this->channel[chan].bank;
  note_00 = note & 0x7f;
  if (((uint)this->drumchannels >> (chan & 0x1fU) & 1) == 0) {
    iVar3 = this->channel[chan].program;
    if (iVar3 == -1) {
      pIVar4 = this->default_instrument;
    }
    else if ((((&tonebank)[iVar2] == 0) ||
             (pIVar4 = *(Instrument **)((&tonebank)[iVar2] + 8 + (long)iVar3 * 8),
             pIVar4 == (Instrument *)0x0)) &&
            (pIVar4 = *(Instrument **)(tonebank + 8 + (long)iVar3 * 8), pIVar4 == (Instrument *)0x0)
            ) {
      return;
    }
    if (pIVar4 == (Instrument *)0xffffffffffffffff) {
      __assert_fail("ip != MAGIC_LOAD_INSTRUMENT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/playmidi.cpp"
                    ,0x175,"void Timidity::Renderer::start_note(int, int, int)");
    }
  }
  else {
    if ((((&drumset)[iVar2] == 0) ||
        (pIVar4 = *(Instrument **)((&drumset)[iVar2] + 8 + (ulong)note_00 * 8),
        pIVar4 == (Instrument *)0x0)) &&
       (pIVar4 = *(Instrument **)(drumset + 8 + (ulong)note_00 * 8), pIVar4 == (Instrument *)0x0)) {
      return;
    }
    if (pIVar4 == (Instrument *)0xffffffffffffffff) {
      __assert_fail("ip != MAGIC_LOAD_INSTRUMENT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/playmidi.cpp"
                    ,0x15f,"void Timidity::Renderer::start_note(int, int, int)");
    }
    if ((pIVar4->samples != 1) && (pIVar4->sample->type == '\0')) {
      cmsg(1,1,"Strange: percussion instrument with %d samples!");
    }
  }
  sp = pIVar4->sample;
  if ((sp == (Sample *)0x0) || (iVar2 = pIVar4->samples, iVar2 == 0)) {
    return;
  }
  if (sp->type != '\0') {
    dVar7 = exp2((double)note_00 * 0.08333333333333333);
    fVar6 = (float)(dVar7 * 8175.798947309669);
    while ((((vel < (int)(uint)sp->low_vel || ((uint)sp->high_vel < (uint)vel)) ||
            (fVar6 < sp->low_freq)) ||
           ((sp->high_freq <= fVar6 && fVar6 != sp->high_freq ||
            (bVar1 = start_region(this,chan,note_00,vel,sp,fVar6), bVar1))))) {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        return;
      }
      sp = sp + 1;
    }
    return;
  }
  if (sp->scale_factor == 0x400) {
    dVar7 = (double)note_00;
  }
  else {
    dVar7 = (double)(int)sp->tune * 0.01 + (double)(int)sp->scale_note +
            (double)(int)((note_00 - (int)sp->scale_note) * (uint)sp->scale_factor) * 0.0009765625;
  }
  dVar7 = exp2(dVar7 * 0.08333333333333333);
  fVar6 = (float)(dVar7 * 8175.798947309669);
  iVar3 = iVar2;
  pSVar5 = sp;
  if (iVar2 == 1) {
    start_region(this,chan,note_00,vel,sp,fVar6);
    iVar2 = pIVar4->samples;
    sp = pIVar4->sample;
    iVar3 = iVar2;
    pSVar5 = sp;
    if (iVar2 == 0) goto LAB_0032c8d6;
  }
  do {
    if (((sp->low_freq <= fVar6) && (fVar6 < sp->high_freq || fVar6 == sp->high_freq)) &&
       ((iVar2 < 2 ||
        ((fVar6 < sp[1].low_freq || (sp[1].high_freq <= fVar6 && fVar6 != sp[1].high_freq))))))
    goto LAB_0032c8d6;
    sp = sp + 1;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  dVar8 = log((double)fVar6 * 0.00012231220538135425);
  dVar7 = 10000000000.0;
  sp = pSVar5;
  do {
    dVar9 = log((double)pSVar5->root_freq * 0.00012231220538135425);
    dVar9 = ABS((dVar9 - dVar8) * 17.312340490667562);
    bVar1 = dVar9 < dVar7;
    if (dVar9 <= dVar7) {
      dVar7 = dVar9;
    }
    if (bVar1) {
      sp = pSVar5;
    }
    pSVar5 = pSVar5 + 1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
LAB_0032c8d6:
  start_region(this,chan,note_00,vel,sp,fVar6);
  return;
}

Assistant:

void Renderer::start_note(int chan, int note, int vel)
{
	Instrument *ip;
	Sample *sp;
	int bank = channel[chan].bank;
	int prog = channel[chan].program;
	int i;
	float f;

	note &= 0x7f;
	if (ISDRUMCHANNEL(chan))
	{
		if (NULL == drumset[bank] || NULL == (ip = drumset[bank]->instrument[note]))
		{
			if (!(ip = drumset[0]->instrument[note]))
				return; /* No instrument? Then we can't play. */
		}
		assert(ip != MAGIC_LOAD_INSTRUMENT);
		if (ip == MAGIC_LOAD_INSTRUMENT)
		{
			return;
		}
		if (ip->samples != 1 && ip->sample->type == INST_GUS)
		{
			cmsg(CMSG_WARNING, VERB_VERBOSE, 
				"Strange: percussion instrument with %d samples!", ip->samples);
		}
	}
	else
	{
		if (channel[chan].program == SPECIAL_PROGRAM)
		{
			ip = default_instrument;
		}
		else if (NULL == tonebank[bank] || NULL == (ip = tonebank[bank]->instrument[prog]))
		{
			if (NULL == (ip = tonebank[0]->instrument[prog]))
				return; /* No instrument? Then we can't play. */
		}
		assert(ip != MAGIC_LOAD_INSTRUMENT);
		if (ip == MAGIC_LOAD_INSTRUMENT)
		{
			return;
		}
	}

	if (NULL == ip->sample || ip->samples == 0)
		return;	/* No samples? Then nothing to play. */

	// For GF1 patches, scaling is based solely on the first
	// waveform in this layer.
	if (ip->sample->type == INST_GUS && ip->sample->scale_factor != 1024)
	{
		f = calculate_scaled_frequency(ip->sample, note);
	}
	else
	{
		f = note_to_freq(note);
	}

	if (ip->sample->type == INST_GUS)
	{
		/* We're more lenient with matching ranges for GUS patches, since the
		 * official Gravis ones don't cover the full range of possible
		 * frequencies for every instrument.
		 */
		if (ip->samples == 1)
		{ // If there's only one sample, definitely play it.
			start_region(chan, note, vel, ip->sample, f);
		}
		for (i = ip->samples, sp = ip->sample; i != 0; --i, ++sp)
		{
			// GUS patches don't have velocity ranges, so no need to compare against them.
			if (sp->low_freq <= f && sp->high_freq >= f)
			{
				if (i > 1 && (sp + 1)->low_freq <= f && (sp + 1)->high_freq >= f)
				{ /* If there is a range of contiguous regions that match our
				   * desired frequency, the last one in that block is used.
				   */
					continue;
				}
				start_region(chan, note, vel, sp, f);
				break;
			}
		}
		if (i == 0)
		{ /* Found nothing. Try again, but look for the one with the closest root frequency.
		   * As per the suggestion in the original TiMidity function, this search uses
		   * note values rather than raw frequencies.
		   */
			double cdiff = 1e10;
			double want_note = freq_to_note(f);
			Sample *closest = sp = ip->sample;
			for (i = ip->samples; i != 0; --i, ++sp)
			{
				double diff = fabs(freq_to_note(sp->root_freq) - want_note);
				if (diff < cdiff)
				{
					cdiff = diff;
					closest = sp;
				}
			}
			start_region(chan, note, vel, closest, f);
		}
	}
	else
	{
		for (i = ip->samples, sp = ip->sample; i != 0; --i, ++sp)
		{
			if ((sp->low_vel <= vel && sp->high_vel >= vel &&
				 sp->low_freq <= f && sp->high_freq >= f))
			{
				if (!start_region(chan, note, vel, sp, f))
				{ // Ran out of voices
					break;
				}
			}
		}
	}
}